

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O2

void __thiscall duckdb::BaseCSVData::Finalize(BaseCSVData *this)

{
  char cVar1;
  pointer pbVar2;
  char *pcVar3;
  size_type sVar4;
  BinderException *pBVar5;
  char cVar6;
  pointer str_2;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> delimiter_string;
  
  local_58 = &(this->options).dialect_options.state_machine_options.delimiter.value;
  ::std::__cxx11::string::string((string *)&delimiter_string,(string *)local_58);
  cVar6 = (this->options).dialect_options.state_machine_options.quote.value;
  ::std::__cxx11::string::string((string *)&local_98,"QUOTE",&local_99);
  ::std::__cxx11::string::string((string *)&local_78,"DELIMITER",&local_9a);
  SubstringDetection(cVar6,&delimiter_string,&local_98,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  cVar6 = (this->options).dialect_options.state_machine_options.escape.value;
  ::std::__cxx11::string::string((string *)&local_98,"ESCAPE",&local_99);
  ::std::__cxx11::string::string((string *)&local_78,"DELIMITER",&local_9a);
  SubstringDetection(cVar6,&delimiter_string,&local_98,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  cVar6 = (this->options).dialect_options.state_machine_options.quote.value;
  cVar1 = (this->options).dialect_options.state_machine_options.escape.value;
  if (cVar6 != cVar1) {
    ::std::__cxx11::string::string((string *)&local_98,"QUOTE",&local_99);
    ::std::__cxx11::string::string((string *)&local_78,"ESCAPE",&local_9a);
    AreOptionsEqual(cVar6,cVar1,&local_98,&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)&local_98);
    cVar6 = (this->options).dialect_options.state_machine_options.quote.value;
  }
  cVar1 = (this->options).dialect_options.state_machine_options.comment.value;
  ::std::__cxx11::string::string((string *)&local_98,"COMMENT",&local_99);
  ::std::__cxx11::string::string((string *)&local_78,"QUOTE",&local_9a);
  AreOptionsEqual(cVar1,cVar6,&local_98,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  cVar6 = (this->options).dialect_options.state_machine_options.comment.value;
  ::std::__cxx11::string::string((string *)&local_98,"COMMENT",&local_99);
  ::std::__cxx11::string::string((string *)&local_78,"DELIMITER",&local_9a);
  SubstringDetection(cVar6,&delimiter_string,&local_98,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  cVar6 = (this->options).thousands_separator;
  ::std::__cxx11::string::string((string *)&local_98,"THOUSANDS",&local_99);
  ::std::__cxx11::string::string((string *)&local_78,"DECIMAL_SEPARATOR",&local_9a);
  SubstringDetection(cVar6,&(this->options).decimal_separator,&local_98,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  pbVar2 = (this->options).null_str.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (str_2 = (this->options).null_str.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; str_2 != pbVar2; str_2 = str_2 + 1) {
    if (str_2->_M_string_length != 0) {
      ::std::__cxx11::string::string((string *)&local_98,"DELIMITER",&local_99);
      ::std::__cxx11::string::string((string *)&local_78,"NULL",&local_9a);
      StringDetection(local_58,str_2,&local_98,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_98);
      cVar6 = (this->options).dialect_options.state_machine_options.quote.value;
      ::std::__cxx11::string::string((string *)&local_98,"QUOTE",&local_99);
      ::std::__cxx11::string::string((string *)&local_78,"NULL",&local_9a);
      SubstringDetection(cVar6,str_2,&local_98,&local_78);
      ::std::__cxx11::string::~string((string *)&local_78);
      ::std::__cxx11::string::~string((string *)&local_98);
      cVar6 = (this->options).dialect_options.state_machine_options.escape.value;
      if (((((this->options).dialect_options.state_machine_options.strict_mode.value != false) ||
           (str_2->_M_string_length != 2)) || (pcVar3 = (str_2->_M_dataplus)._M_p, *pcVar3 != cVar6)
          ) || (pcVar3[1] == '\0')) {
        ::std::__cxx11::string::string((string *)&local_98,"ESCAPE",&local_99);
        ::std::__cxx11::string::string((string *)&local_78,"NULL",&local_9a);
        SubstringDetection(cVar6,str_2,&local_98,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::__cxx11::string::~string((string *)&local_98);
      }
    }
  }
  sVar4 = (this->options).suffix._M_string_length;
  if ((this->options).prefix._M_string_length == 0) {
    if (sVar4 != 0) goto LAB_018ae32b;
  }
  else {
    if (sVar4 == 0) {
LAB_018ae32b:
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_98,
                 "COPY ... (FORMAT CSV) must have both PREFIX and SUFFIX, or none at all",
                 (allocator *)&local_78);
      BinderException::BinderException(pBVar5,&local_98);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((this->options).dialect_options.header.value == true) {
      pBVar5 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_98,
                 "COPY ... (FORMAT CSV)\'s HEADER cannot be combined with PREFIX/SUFFIX",
                 (allocator *)&local_78);
      BinderException::BinderException(pBVar5,&local_98);
      __cxa_throw(pBVar5,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  ::std::__cxx11::string::~string((string *)&delimiter_string);
  return;
}

Assistant:

void BaseCSVData::Finalize() {
	auto delimiter_string = options.dialect_options.state_machine_options.delimiter.GetValue();

	// quote and delimiter must not be substrings of each other
	SubstringDetection(options.dialect_options.state_machine_options.quote.GetValue(), delimiter_string, "QUOTE",
	                   "DELIMITER");

	// escape and delimiter must not be substrings of each other
	SubstringDetection(options.dialect_options.state_machine_options.escape.GetValue(), delimiter_string, "ESCAPE",
	                   "DELIMITER");

	// escape and quote must not be substrings of each other (but can be the same)
	if (options.dialect_options.state_machine_options.quote != options.dialect_options.state_machine_options.escape) {
		AreOptionsEqual(options.dialect_options.state_machine_options.quote.GetValue(),
		                options.dialect_options.state_machine_options.escape.GetValue(), "QUOTE", "ESCAPE");
	}

	// comment and quote must not be substrings of each other
	AreOptionsEqual(options.dialect_options.state_machine_options.comment.GetValue(),
	                options.dialect_options.state_machine_options.quote.GetValue(), "COMMENT", "QUOTE");

	// delimiter and comment must not be substrings of each other
	SubstringDetection(options.dialect_options.state_machine_options.comment.GetValue(), delimiter_string, "COMMENT",
	                   "DELIMITER");

	// quote and delimiter must not be substrings of each other
	SubstringDetection(options.thousands_separator, options.decimal_separator, "THOUSANDS", "DECIMAL_SEPARATOR");

	// null string and delimiter must not be substrings of each other
	for (auto &null_str : options.null_str) {
		if (!null_str.empty()) {
			StringDetection(options.dialect_options.state_machine_options.delimiter.GetValue(), null_str, "DELIMITER",
			                "NULL");

			// quote and nullstr must not be substrings of each other
			SubstringDetection(options.dialect_options.state_machine_options.quote.GetValue(), null_str, "QUOTE",
			                   "NULL");

			// Validate the nullstr against the escape character
			const char escape = options.dialect_options.state_machine_options.escape.GetValue();
			// Allow nullstr to be escape character + some non-special character, e.g., "\N" (MySQL default).
			// In this case, only unquoted occurrences of the nullstr will be recognized as null values.
			if (options.dialect_options.state_machine_options.strict_mode == false && null_str.size() == 2 &&
			    null_str[0] == escape && null_str[1] != '\0') {
				continue;
			}
			SubstringDetection(escape, null_str, "ESCAPE", "NULL");
		}
	}

	if (!options.prefix.empty() || !options.suffix.empty()) {
		if (options.prefix.empty() || options.suffix.empty()) {
			throw BinderException("COPY ... (FORMAT CSV) must have both PREFIX and SUFFIX, or none at all");
		}
		if (options.dialect_options.header.GetValue()) {
			throw BinderException("COPY ... (FORMAT CSV)'s HEADER cannot be combined with PREFIX/SUFFIX");
		}
	}
}